

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl.h
# Opt level: O0

void __thiscall flatbuffers::FieldDef::FieldDef(FieldDef *this)

{
  FieldDef *this_local;
  
  Definition::Definition(&this->super_Definition);
  Value::Value(&this->value);
  this->deprecated = false;
  this->key = false;
  this->shared = false;
  this->native_inline = false;
  this->flexbuffer = false;
  this->offset64 = false;
  this->presence = kDefault;
  this->nested_flatbuffer = (StructDef *)0x0;
  this->padding = 0;
  this->sibling_union_field = (FieldDef *)0x0;
  return;
}

Assistant:

FieldDef()
      : deprecated(false),
        key(false),
        shared(false),
        native_inline(false),
        flexbuffer(false),
        offset64(false),
        presence(kDefault),
        nested_flatbuffer(nullptr),
        padding(0),
        sibling_union_field(nullptr) {}